

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
rlib::string::format<char,std::__cxx11::string&>
          (char *lpszFormat,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string_type *in_stack_00000058;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *format_00;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string local_118 [32];
  pointer in_stack_ffffffffffffff08;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  
  format_00 = in_RDI;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::exceptions
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff08,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            (in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  inner::f<char,std::__cxx11::string>(format_00,in_stack_fffffffffffffe98);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (in_stack_ffffffffffffff18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(format_00)
  ;
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}